

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O0

void Bozo_sort(int *arr,int len,Order type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int local_30;
  int local_2c;
  int i_1;
  int index2_1;
  int index1_1;
  int i;
  int index2;
  int index1;
  Order type_local;
  int len_local;
  int *arr_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"BOZO ARR");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (type == ABC) {
    while (bVar1 = is_sort(arr,len,ABC), ((bVar1 ^ 0xffU) & 1) != 0) {
      iVar2 = rand();
      local_2c = rand();
      local_2c = local_2c % (len + -1);
      if (local_2c <= iVar2 % len) {
        local_2c = local_2c + 1;
      }
      std::swap<int>(arr + iVar2 % len,arr + local_2c);
      for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[local_30]);
        std::operator<<(poVar4,' ');
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (type == DESC) {
    while (bVar1 = is_sort(arr,len,DESC), ((bVar1 ^ 0xffU) & 1) != 0) {
      iVar2 = rand();
      iVar3 = rand();
      index1_1 = iVar3 % (len + -1);
      if (iVar2 % len <= index1_1) {
        index1_1 = index1_1 + 1;
      }
      std::swap<int>(arr + iVar2 % len,arr + index1_1);
      for (index2_1 = 0; index2_1 < len; index2_1 = index2_1 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[index2_1]);
        std::operator<<(poVar4,' ');
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Bozo_sort(int* arr, int len, Order type = ABC){
    cout << "BOZO ARR" << endl;
    switch (type) {
        case DESC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 >= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
        case ABC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 <= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
    }
}